

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Matrix<float,_3,_2>_>::VariableStatement
          (VariableStatement<tcu::Matrix<float,_3,_2>_> *this,
          VariableP<tcu::Matrix<float,_3,_2>_> *variable,ExprP<tcu::Matrix<float,_3,_2>_> *value,
          bool isDeclaration)

{
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__VariableStatement_00c157d0;
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>::SharedPtr
            (&(this->m_variable).
              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>,
             &variable->
              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_2>_>_>::SharedPtr
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_2>_>_> *)
             &this->m_value,
             (SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_2>_>_> *)value);
  this->m_isDeclaration = isDeclaration;
  return;
}

Assistant:

VariableStatement	(const VariableP<T>& variable, const ExprP<T>& value,
										 bool isDeclaration)
						: m_variable		(variable)
						, m_value			(value)
						, m_isDeclaration	(isDeclaration) {}